

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btSoftBodyTriangleCallback::processTriangle
          (btSoftBodyTriangleCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  btIDebugDraw *pbVar4;
  btCollisionObject *pbVar5;
  btTriIndex *pbVar6;
  btCollisionShape *pbVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  long *plVar14;
  btConvexHullShape *this_00;
  undefined4 extraout_var_00;
  btDispatcher *pbVar15;
  undefined8 in_R9;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  btHashKey<btTriIndex> triKey;
  btTriIndex triIndex;
  btCollisionObjectWrapper triBody;
  btCollisionObjectWrapper triBody_1;
  btCollisionObjectWrapper softBody;
  btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this_01;
  btHashKey<btTriIndex> local_12c;
  undefined1 local_128 [16];
  btTriIndex local_110;
  undefined1 local_100 [16];
  btSoftBody *local_f0;
  btTransform *local_e8;
  undefined8 local_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c0 [16];
  btCollisionObject *local_b0;
  btTransform *local_a8;
  int local_a0;
  int local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined4 extraout_var;
  
  local_78._8_8_ = local_78._0_8_;
  pbVar15 = this->m_dispatcher;
  if ((this->m_dispatchInfoPtr != (btDispatcherInfo *)0x0) &&
     (pbVar4 = this->m_dispatchInfoPtr->m_debugDraw, pbVar4 != (btIDebugDraw *)0x0)) {
    uVar12 = (*pbVar4->_vptr_btIDebugDraw[0xe])();
    if ((uVar12 & 1) != 0) {
      local_98 = ZEXT816(0x3f8000003f800000);
      local_128._0_8_ = pbVar15;
      pbVar5 = this->m_triBody;
      pbVar4 = this->m_dispatchInfoPtr->m_debugDraw;
      fVar21 = triangle->m_floats[0];
      fVar22 = triangle->m_floats[1];
      fVar16 = triangle->m_floats[2];
      fVar18 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[0];
      fVar17 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[1];
      fVar19 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[2];
      fVar20 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[1];
      fVar25 = (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[2];
      fVar26 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[0];
      fVar1 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[2];
      uVar3 = *(undefined8 *)(pbVar5->m_worldTransform).m_origin.m_floats;
      fVar23 = (float)uVar3;
      fVar24 = (float)((ulong)uVar3 >> 0x20);
      fVar2 = (pbVar5->m_worldTransform).m_origin.m_floats[2];
      local_100._4_4_ = fVar16 * fVar1 + fVar26 * fVar21 + fVar20 * fVar22 + fVar24;
      local_100._0_4_ =
           fVar16 * fVar25 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[0] * fVar21 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[1] * fVar22 + fVar23;
      local_100._8_4_ = fVar16 * fVar19 + fVar21 * fVar18 + fVar22 * fVar17 + fVar2;
      local_100._12_4_ = 0;
      fVar21 = triangle[1].m_floats[0];
      fVar22 = triangle[1].m_floats[1];
      fVar16 = triangle[1].m_floats[2];
      local_c0._4_4_ = fVar16 * fVar1 + fVar26 * fVar21 + fVar22 * fVar20 + fVar24;
      local_c0._0_4_ =
           fVar16 * fVar25 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[0] * fVar21 +
           fVar22 * (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[1] + fVar23;
      local_c0._8_4_ = fVar19 * fVar16 + fVar18 * fVar21 + fVar17 * fVar22 + fVar2;
      local_c0._12_4_ = 0;
      (*pbVar4->_vptr_btIDebugDraw[4])(pbVar4,local_100,local_c0);
      pbVar4 = this->m_dispatchInfoPtr->m_debugDraw;
      fVar21 = triangle[1].m_floats[0];
      fVar22 = triangle[1].m_floats[1];
      fVar16 = triangle[1].m_floats[2];
      fVar18 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[0];
      fVar17 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[1];
      fVar19 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[2];
      fVar20 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[1];
      fVar25 = (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[2];
      fVar26 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[0];
      fVar1 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[2];
      uVar3 = *(undefined8 *)(pbVar5->m_worldTransform).m_origin.m_floats;
      fVar23 = (float)uVar3;
      fVar24 = (float)((ulong)uVar3 >> 0x20);
      fVar2 = (pbVar5->m_worldTransform).m_origin.m_floats[2];
      local_100._4_4_ = fVar16 * fVar1 + fVar26 * fVar21 + fVar20 * fVar22 + fVar24;
      local_100._0_4_ =
           fVar16 * fVar25 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[0] * fVar21 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[1] * fVar22 + fVar23;
      local_100._8_4_ = fVar16 * fVar19 + fVar21 * fVar18 + fVar22 * fVar17 + fVar2;
      local_100._12_4_ = 0;
      fVar21 = triangle[2].m_floats[0];
      fVar22 = triangle[2].m_floats[1];
      fVar16 = triangle[2].m_floats[2];
      local_c0._4_4_ = fVar16 * fVar1 + fVar26 * fVar21 + fVar22 * fVar20 + fVar24;
      local_c0._0_4_ =
           fVar16 * fVar25 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[0] * fVar21 +
           fVar22 * (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[1] + fVar23;
      local_c0._8_4_ = fVar19 * fVar16 + fVar18 * fVar21 + fVar17 * fVar22 + fVar2;
      local_c0._12_4_ = 0;
      (*pbVar4->_vptr_btIDebugDraw[4])(pbVar4,local_100,local_c0,local_98);
      pbVar4 = this->m_dispatchInfoPtr->m_debugDraw;
      fVar21 = triangle[2].m_floats[0];
      fVar22 = triangle[2].m_floats[1];
      fVar16 = triangle[2].m_floats[2];
      fVar18 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[0];
      fVar17 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[1];
      fVar19 = (pbVar5->m_worldTransform).m_basis.m_el[2].m_floats[2];
      fVar20 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[1];
      fVar25 = (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[2];
      fVar26 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[0];
      fVar1 = (pbVar5->m_worldTransform).m_basis.m_el[1].m_floats[2];
      uVar3 = *(undefined8 *)(pbVar5->m_worldTransform).m_origin.m_floats;
      fVar23 = (float)uVar3;
      fVar24 = (float)((ulong)uVar3 >> 0x20);
      fVar2 = (pbVar5->m_worldTransform).m_origin.m_floats[2];
      local_100._4_4_ = fVar16 * fVar1 + fVar26 * fVar21 + fVar20 * fVar22 + fVar24;
      local_100._0_4_ =
           fVar16 * fVar25 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[0] * fVar21 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[1] * fVar22 + fVar23;
      local_100._8_4_ = fVar16 * fVar19 + fVar21 * fVar18 + fVar22 * fVar17 + fVar2;
      local_100._12_4_ = 0;
      fVar21 = triangle->m_floats[0];
      fVar22 = triangle->m_floats[1];
      fVar16 = triangle->m_floats[2];
      pbVar15 = (btDispatcher *)local_128._0_8_;
      local_c0._4_4_ = fVar16 * fVar1 + fVar26 * fVar21 + fVar22 * fVar20 + fVar24;
      local_c0._0_4_ =
           fVar16 * fVar25 +
           (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[0] * fVar21 +
           fVar22 * (pbVar5->m_worldTransform).m_basis.m_el[0].m_floats[1] + fVar23;
      local_c0._8_4_ = fVar19 * fVar16 + fVar18 * fVar21 + fVar17 * fVar22 + fVar2;
      local_c0._12_4_ = 0;
      (*pbVar4->_vptr_btIDebugDraw[4])(pbVar4,local_100,local_c0,local_98);
    }
  }
  local_12c.m_uid = partId << 0x15 | triangleIndex;
  local_110.m_childShape = (btCollisionShape *)0x0;
  this_01 = &this->m_shapeCache;
  local_110.m_PartIdTriangleIndex = local_12c.m_uid;
  iVar13 = btHashMap<btHashKey<btTriIndex>,_btTriIndex>::findIndex(this_01,&local_12c);
  pbVar6 = (this->m_shapeCache).m_valueArray.m_data;
  if (pbVar6 == (btTriIndex *)0x0 || iVar13 == -1) {
    fVar18 = triangle[1].m_floats[0] - triangle->m_floats[0];
    fVar25 = (float)*(undefined8 *)(triangle->m_floats + 1);
    fVar26 = (float)((ulong)*(undefined8 *)(triangle->m_floats + 1) >> 0x20);
    fVar16 = (float)*(undefined8 *)(triangle[1].m_floats + 1) - fVar25;
    fVar17 = (float)((ulong)*(undefined8 *)(triangle[1].m_floats + 1) >> 0x20) - fVar26;
    fVar25 = triangle[2].m_floats[1] - fVar25;
    fVar19 = triangle[2].m_floats[2] - fVar26;
    fVar20 = triangle[2].m_floats[0] - triangle->m_floats[0];
    fVar21 = fVar16 * fVar19 - fVar25 * fVar17;
    fVar22 = fVar17 * fVar20 - fVar19 * fVar18;
    fVar16 = fVar25 * fVar18 - fVar20 * fVar16;
    fVar18 = fVar16 * fVar16 + fVar21 * fVar21 + fVar22 * fVar22;
    if (fVar18 < 0.0) {
      local_128 = ZEXT416((uint)fVar16);
      local_d8 = fVar21;
      fStack_d4 = fVar22;
      fStack_d0 = (0.0 - fVar26) * 0.0 - fVar19 * fVar17;
      fStack_cc = (0.0 - fVar26) * 0.0 - fVar19 * fVar17;
      fVar18 = sqrtf(fVar18);
      fVar21 = local_d8;
      fVar22 = fStack_d4;
      fVar16 = (float)local_128._0_4_;
    }
    else {
      fVar18 = SQRT(fVar18);
    }
    fVar18 = 1.0 / fVar18;
    fVar21 = fVar18 * fVar21 * 0.06;
    fVar22 = fVar18 * fVar22 * 0.06;
    fVar26 = fVar16 * fVar18 * 0.06;
    fVar16 = (float)*(undefined8 *)triangle->m_floats;
    fVar18 = (float)((ulong)*(undefined8 *)triangle->m_floats >> 0x20);
    local_98._4_4_ = fVar18 + fVar22;
    local_98._0_4_ = fVar16 + fVar21;
    local_98._8_4_ = fVar26 + triangle->m_floats[2];
    local_98._12_4_ = 0;
    fVar17 = (float)*(undefined8 *)triangle[1].m_floats;
    fVar19 = (float)((ulong)*(undefined8 *)triangle[1].m_floats >> 0x20);
    local_88._4_4_ = fVar22 + fVar19;
    local_88._0_4_ = fVar21 + fVar17;
    local_88._8_4_ = fVar26 + triangle[1].m_floats[2];
    local_88._12_4_ = 0;
    fVar20 = (float)*(undefined8 *)triangle[2].m_floats;
    fVar25 = (float)((ulong)*(undefined8 *)triangle[2].m_floats >> 0x20);
    local_78._4_4_ = fVar22 + fVar25;
    local_78._0_4_ = fVar21 + fVar20;
    local_78._8_4_ = fVar26 + triangle[2].m_floats[2];
    local_78._12_4_ = 0;
    local_68._4_4_ = fVar18 - fVar22;
    local_68._0_4_ = fVar16 - fVar21;
    local_68._8_4_ = triangle->m_floats[2] - fVar26;
    local_68._12_4_ = 0;
    local_58._4_4_ = fVar19 - fVar22;
    local_58._0_4_ = fVar17 - fVar21;
    local_58._8_4_ = triangle[1].m_floats[2] - fVar26;
    local_58._12_4_ = 0;
    local_48._4_4_ = fVar25 - fVar22;
    local_48._0_4_ = fVar20 - fVar21;
    local_48._8_4_ = triangle[2].m_floats[2] - fVar26;
    local_48._12_4_ = 0;
    this_00 = (btConvexHullShape *)btAlignedAllocInternal(0x98,0x10);
    btConvexHullShape::btConvexHullShape(this_00,(btScalar *)local_98,6,0x10);
    local_b0 = this->m_triBody;
    (this_00->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
    super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_userPointer =
         local_b0->m_collisionShape->m_userPointer;
    local_f0 = this->m_softBody;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (local_f0->super_btCollisionObject).m_collisionShape;
    local_100 = auVar10 << 0x40;
    local_e8 = &(local_f0->super_btCollisionObject).m_worldTransform;
    local_e0 = 0xffffffffffffffff;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = this_00;
    local_c0 = auVar11 << 0x40;
    local_a8 = &local_b0->m_worldTransform;
    local_a0 = partId;
    local_9c = triangleIndex;
    iVar13 = (*pbVar15->_vptr_btDispatcher[2])(pbVar15,local_100,local_c0,0);
    plVar14 = (long *)CONCAT44(extraout_var_00,iVar13);
    (**(code **)(*plVar14 + 0x10))
              (plVar14,local_100,local_c0,this->m_dispatchInfoPtr,this->m_resultOut,in_R9,this_01,
               triangleIndex);
    (**(code **)*plVar14)(plVar14);
    (*pbVar15->_vptr_btDispatcher[0xf])(pbVar15,plVar14);
    local_110.m_childShape = (btCollisionShape *)this_00;
    btHashMap<btHashKey<btTriIndex>,_btTriIndex>::insert(this_01,&local_12c,&local_110);
  }
  else {
    pbVar7 = pbVar6[iVar13].m_childShape;
    local_f0 = (btSoftBody *)this->m_triBody;
    pbVar7->m_userPointer = ((btCollisionObject *)local_f0)->m_collisionShape->m_userPointer;
    local_88._0_8_ = this->m_softBody;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (((btSoftBody *)local_88._0_8_)->super_btCollisionObject).m_collisionShape;
    local_98 = auVar8 << 0x40;
    local_88._8_8_ = &(((btSoftBody *)local_88._0_8_)->super_btCollisionObject).m_worldTransform;
    local_78._0_8_ = 0xffffffffffffffff;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pbVar7;
    local_100 = auVar9 << 0x40;
    local_e8 = &((btCollisionObject *)local_f0)->m_worldTransform;
    local_e0 = CONCAT44(triangleIndex,partId);
    iVar13 = (*pbVar15->_vptr_btDispatcher[2])(pbVar15,local_98,local_100,0);
    plVar14 = (long *)CONCAT44(extraout_var,iVar13);
    (**(code **)(*plVar14 + 0x10))
              (plVar14,local_98,local_100,this->m_dispatchInfoPtr,this->m_resultOut);
    (**(code **)*plVar14)(plVar14);
    (*pbVar15->_vptr_btDispatcher[0xf])(pbVar15,plVar14);
  }
  return;
}

Assistant:

void btSoftBodyTriangleCallback::processTriangle(btVector3* triangle,int partId, int triangleIndex)
{
	//just for debugging purposes
	//printf("triangle %d",m_triangleCount++);
	
	btCollisionAlgorithmConstructionInfo ci;
	ci.m_dispatcher1 = m_dispatcher;

	///debug drawing of the overlapping triangles
	if (m_dispatchInfoPtr && m_dispatchInfoPtr->m_debugDraw && (m_dispatchInfoPtr->m_debugDraw->getDebugMode() &btIDebugDraw::DBG_DrawWireframe))
	{
		btVector3 color(1,1,0);
		const btTransform& tr = m_triBody->getWorldTransform();
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[0]),tr(triangle[1]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[1]),tr(triangle[2]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[2]),tr(triangle[0]),color);
	}

	btTriIndex	triIndex(partId,triangleIndex,0);
	btHashKey<btTriIndex> triKey(triIndex.getUid());


	btTriIndex* shapeIndex = m_shapeCache[triKey];
	if (shapeIndex)
	{
		btCollisionShape* tm = shapeIndex->m_childShape;
		btAssert(tm);

		//copy over user pointers to temporary shape
		tm->setUserPointer(m_triBody->getCollisionShape()->getUserPointer());

		btCollisionObjectWrapper softBody(0,m_softBody->getCollisionShape(),m_softBody,m_softBody->getWorldTransform(),-1,-1);
		//btCollisionObjectWrapper triBody(0,tm, ob, btTransform::getIdentity());//ob->getWorldTransform());//??
		btCollisionObjectWrapper triBody(0,tm, m_triBody, m_triBody->getWorldTransform(),partId, triangleIndex);

		btCollisionAlgorithm* colAlgo = ci.m_dispatcher1->findAlgorithm(&softBody,&triBody,0);//m_manifoldPtr);

		colAlgo->processCollision(&softBody,&triBody,*m_dispatchInfoPtr,m_resultOut);
		colAlgo->~btCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);
		
		return;
	}

	//aabb filter is already applied!	

	//btCollisionObject* colObj = static_cast<btCollisionObject*>(m_convexProxy->m_clientObject);

	//	if (m_softBody->getCollisionShape()->getShapeType()==
	{
		//		btVector3 other;
		btVector3 normal = (triangle[1]-triangle[0]).cross(triangle[2]-triangle[0]);
		normal.normalize();
		normal*= BT_SOFTBODY_TRIANGLE_EXTRUSION;
		//		other=(triangle[0]+triangle[1]+triangle[2])*0.333333f;
		//		other+=normal*22.f;
		btVector3	pts[6] = {triangle[0]+normal,
			triangle[1]+normal,
			triangle[2]+normal,
			triangle[0]-normal,
			triangle[1]-normal,
			triangle[2]-normal};

		btConvexHullShape* tm = new btConvexHullShape(&pts[0].getX(),6);


		//		btBU_Simplex1to4 tm(triangle[0],triangle[1],triangle[2],other);

		//btTriangleShape tm(triangle[0],triangle[1],triangle[2]);	
		//	tm.setMargin(m_collisionMarginTriangle);

		//copy over user pointers to temporary shape
		tm->setUserPointer(m_triBody->getCollisionShape()->getUserPointer());

		
		btCollisionObjectWrapper softBody(0,m_softBody->getCollisionShape(),m_softBody,m_softBody->getWorldTransform(),-1,-1);
		btCollisionObjectWrapper triBody(0,tm, m_triBody, m_triBody->getWorldTransform(),partId, triangleIndex);//btTransform::getIdentity());//??

		btCollisionAlgorithm* colAlgo = ci.m_dispatcher1->findAlgorithm(&softBody,&triBody,0);//m_manifoldPtr);

		colAlgo->processCollision(&softBody,&triBody,*m_dispatchInfoPtr,m_resultOut);
		colAlgo->~btCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);

		triIndex.m_childShape = tm;
		m_shapeCache.insert(triKey,triIndex);

	}



}